

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O1

idx_t __thiscall
duckdb::PhysicalInsert::OnConflictHandling
          (PhysicalInsert *this,TableCatalogEntry *table,ExecutionContext *context,
          InsertGlobalState *gstate,InsertLocalState *lstate,DataChunk *insert_chunk)

{
  unsigned_long *puVar1;
  SelectionVector *this_00;
  pointer puVar2;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *puVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  byte bVar6;
  SelectionVector *pSVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *count;
  PhysicalInsert *op;
  undefined8 uVar9;
  SelectionVector *pSVar10;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *puVar11;
  bool bVar12;
  int iVar13;
  undefined4 extraout_var;
  LocalStorage *this_01;
  shared_ptr<duckdb::DataTableInfo,_true> *this_02;
  DataTableInfo *pDVar14;
  pthread_mutex_t *__mutex;
  type pIVar15;
  mapped_type *pmVar16;
  ConstraintState *constraint_state;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  _Base_ptr p_Var17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  _Rb_tree_node_base *p_Var19;
  idx_t iVar20;
  idx_t iVar21;
  NotImplementedException *this_03;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *index;
  pointer this_04;
  unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *this_05;
  __node_base _Var22;
  unsigned_long *__v;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  TableCatalogEntry *table_01;
  BoundIndex *bound_index;
  _Hash_node_base *p_Var24;
  _Rb_tree_header *p_Var25;
  InsertGlobalState *gstate_00;
  _Rb_tree_header *p_Var26;
  InsertLocalState *lstate_00;
  _Hash_node_base *p_Var27;
  vector<std::reference_wrapper<duckdb::Vector>,_true> columns;
  ValidityMask valid;
  ConflictInfo conflict_info;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
  sort_keys;
  map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  inner_conflicts;
  unordered_set<duckdb::BoundIndex_*,_std::hash<duckdb::BoundIndex_*>,_std::equal_to<duckdb::BoundIndex_*>,_std::allocator<duckdb::BoundIndex_*>_>
  matched_indexes;
  reference_wrapper<duckdb::Vector> local_1d8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> sStack_1d0;
  _Hash_node_base *local_1c0;
  undefined1 local_1b8 [8];
  reference_wrapper<duckdb::Vector> *prStack_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_node_base *local_1a0;
  _Rb_tree_node_base *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  PhysicalInsert *local_180;
  undefined1 local_178 [32];
  undefined8 uStack_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  OptionalSelection local_148;
  pthread_mutex_t *local_120;
  TableCatalogEntry *local_118;
  InsertLocalState *local_110;
  InsertGlobalState *local_108;
  ConflictInfo local_100;
  undefined1 local_f0 [32];
  _Prime_rehash_policy local_d0;
  OptionalSelection OStack_c0;
  _Hash_node_base *local_a0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
  local_98;
  _Hashtable<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  DataTable *table_00;
  
  local_108 = gstate;
  iVar13 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
             [0x10])(table);
  table_00 = (DataTable *)CONCAT44(extraout_var,iVar13);
  this_01 = LocalStorage::Get(context->client,table_00->db);
  if (this->action_type == THROW) {
    constraint_state = InsertLocalState::GetConstraintState(lstate,table_00,table);
    storage = LocalStorage::GetStorage(this_01,table_00);
    iVar21 = 0;
    DataTable::VerifyAppendConstraints
              (table_00,constraint_state,context->client,insert_chunk,storage,
               (optional_ptr<duckdb::ConflictManager,_true>)0x0);
  }
  else {
    local_100.column_ids = &this->conflict_target;
    local_100.only_check_unique = true;
    local_180 = this;
    local_118 = table;
    local_110 = lstate;
    this_02 = DataTable::GetDataTableInfo(table_00);
    pDVar14 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_02);
    __mutex = (pthread_mutex_t *)LocalStorage::GetIndexes(this_01,context->client,table_00);
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    if (((local_100.column_ids)->_M_h)._M_element_count == 0) {
      local_120 = (pthread_mutex_t *)&pDVar14->indexes;
      iVar13 = pthread_mutex_lock(local_120);
      if (iVar13 != 0) {
        ::std::__throw_system_error(iVar13);
      }
      this_04 = (pDVar14->indexes).indexes.
                super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pDVar14->indexes).indexes.
               super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_04 != puVar2) {
        do {
          pIVar15 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (this_04);
          iVar13 = (*pIVar15->_vptr_Index[5])(pIVar15);
          if (((byte)((char)iVar13 - 1U) < 2) &&
             (bVar12 = ConflictInfo::ConflictTargetMatches(&local_100,pIVar15), bVar12)) {
            local_178._0_8_ = pIVar15;
            local_f0._0_8_ = &local_68;
            ::std::
            _Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<duckdb::BoundIndex*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::BoundIndex*,false>>>>
                      ((_Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,local_178,local_f0);
          }
          this_04 = this_04 + 1;
        } while (this_04 != puVar2);
      }
      pthread_mutex_unlock(local_120);
      iVar13 = pthread_mutex_lock(__mutex);
      if (iVar13 != 0) {
        ::std::__throw_system_error(iVar13);
      }
      this_05 = (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)
                __mutex[1].__align;
      puVar3 = *(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> **)
                ((long)__mutex + 0x30);
      if (this_05 != puVar3) {
        do {
          pIVar15 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                              (this_05);
          iVar13 = (*pIVar15->_vptr_Index[5])(pIVar15);
          if (((byte)((char)iVar13 - 1U) < 2) &&
             (bVar12 = ConflictInfo::ConflictTargetMatches(&local_100,pIVar15), bVar12)) {
            local_178._0_8_ = pIVar15;
            local_f0._0_8_ = &local_68;
            ::std::
            _Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<duckdb::BoundIndex*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::BoundIndex*,false>>>>
                      ((_Hashtable<duckdb::BoundIndex*,duckdb::BoundIndex*,std::allocator<duckdb::BoundIndex*>,std::__detail::_Identity,std::equal_to<duckdb::BoundIndex*>,std::hash<duckdb::BoundIndex*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_68,local_178,local_f0);
          }
          this_05 = this_05 + 1;
        } while (this_05 != puVar3);
      }
      pthread_mutex_unlock(__mutex);
    }
    puVar11 = local_100.column_ids;
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f0._0_8_ = &OStack_c0;
    local_f0._8_8_ = 1;
    local_f0._16_8_ = (_Hash_node_base *)0x0;
    local_f0._24_8_ = (sel_t *)0x0;
    local_d0._M_max_load_factor = 1.0;
    local_d0._M_next_resize = 0;
    OStack_c0.sel = (SelectionVector *)0x0;
    local_178._24_8_ = insert_chunk->count;
    local_178._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178._0_8_ = (element_type *)0x0;
    local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    if (((local_100.column_ids)->_M_h)._M_element_count == 0) {
      if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
        _Var22._M_nxt = local_68._M_before_begin._M_nxt;
        do {
          p_Var24 = _Var22._M_nxt[1]._M_nxt;
          PrepareSortKeys(insert_chunk,
                          (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                           *)local_f0,
                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)(p_Var24 + 4));
          local_1b8 = (undefined1  [8])0x0;
          prStack_1b0 = (reference_wrapper<duckdb::Vector> *)0x0;
          local_1a8 = (_Base_ptr)0x0;
          for (p_Var24 = p_Var24[6]._M_nxt; p_Var24 != (_Hash_node_base *)0x0;
              p_Var24 = p_Var24->_M_nxt) {
            pmVar16 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_f0,(key_type *)(p_Var24 + 1));
            local_1d8._M_data =
                 unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           (pmVar16);
            if ((_Base_ptr)prStack_1b0 == local_1a8) {
              ::std::
              vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
              ::_M_realloc_insert<std::reference_wrapper<duckdb::Vector>>
                        ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                          *)local_1b8,(iterator)prStack_1b0,&local_1d8);
            }
            else {
              prStack_1b0->_M_data = local_1d8._M_data;
              prStack_1b0 = prStack_1b0 + 1;
            }
          }
          CheckDistinctnessInternal
                    ((ValidityMask *)local_178,
                     (vector<std::reference_wrapper<duckdb::Vector>,_true> *)local_1b8,
                     insert_chunk->count,
                     (map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                      *)&local_98);
          if (local_1b8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_1b8);
          }
          _Var22._M_nxt = (_Var22._M_nxt)->_M_nxt;
        } while (_Var22._M_nxt != (_Hash_node_base *)0x0);
      }
    }
    else {
      PrepareSortKeys(insert_chunk,
                      (unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>_>
                       *)local_f0,local_100.column_ids);
      local_1b8 = (undefined1  [8])0x0;
      prStack_1b0 = (reference_wrapper<duckdb::Vector> *)0x0;
      local_1a8 = (_Base_ptr)0x0;
      p_Var24 = (puVar11->_M_h)._M_before_begin._M_nxt;
      if (p_Var24 != (_Hash_node_base *)0x0) {
        do {
          pmVar16 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_f0,(key_type *)(p_Var24 + 1));
          local_1d8._M_data =
               unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (pmVar16);
          if ((_Base_ptr)prStack_1b0 == local_1a8) {
            ::std::
            vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
            ::_M_realloc_insert<std::reference_wrapper<duckdb::Vector>>
                      ((vector<std::reference_wrapper<duckdb::Vector>,std::allocator<std::reference_wrapper<duckdb::Vector>>>
                        *)local_1b8,(iterator)prStack_1b0,&local_1d8);
          }
          else {
            prStack_1b0->_M_data = local_1d8._M_data;
            prStack_1b0 = prStack_1b0 + 1;
          }
          p_Var24 = p_Var24->_M_nxt;
        } while (p_Var24 != (_Hash_node_base *)0x0);
      }
      CheckDistinctnessInternal
                ((ValidityMask *)local_178,
                 (vector<std::reference_wrapper<duckdb::Vector>,_true> *)local_1b8,
                 insert_chunk->count,
                 (map<unsigned_long,_duckdb::vector<unsigned_long,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
                  *)&local_98);
      if (local_1b8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1b8);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._16_8_);
    }
    ::std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_f0);
    table_01 = local_118;
    gstate_00 = local_108;
    lstate_00 = local_110;
    if (local_98._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var24 = (_Hash_node_base *)insert_chunk->count;
      local_f0[0] = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     )0x1;
      local_f0._24_8_ = (sel_t *)0x0;
      local_d0._M_max_load_factor = 0.0;
      local_d0._4_4_ = 0;
      local_d0._M_next_resize = 0;
      local_f0._16_8_ = p_Var24;
      OptionalSelection::OptionalSelection(&OStack_c0,(SelectionVector *)0x0);
      local_f0._8_8_ = 0;
      if (local_f0[0] !=
          (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           )0x0) {
        SelectionVector::Initialize((SelectionVector *)(local_f0 + 0x18),(idx_t)p_Var24);
        _Var8._M_pi = OStack_c0.vec.selection_data.internal.
                      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        OStack_c0.vec.sel_vector = (sel_t *)local_f0._24_8_;
        OStack_c0.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        OStack_c0.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          OStack_c0.sel = (SelectionVector *)(local_f0 + 0x18);
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
        }
        OStack_c0.sel = &OStack_c0.vec;
      }
      local_1d8._M_data = (type)0x0;
      sStack_1d0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      sStack_1d0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0 = (_Rb_tree_node_base *)&prStack_1b0;
      prStack_1b0 = (reference_wrapper<duckdb::Vector> *)((ulong)prStack_1b0 & 0xffffffff00000000);
      local_1a8 = (_Base_ptr)0x0;
      local_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1c0 = p_Var24;
      local_198 = local_1a0;
      if (p_Var24 != (_Hash_node_base *)0x0) {
        p_Var27 = (_Hash_node_base *)0x0;
        do {
          p_Var25 = &local_98._M_impl.super__Rb_tree_header;
          p_Var17 = &p_Var25->_M_header;
          for (p_Var4 = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
              p_Var4 = (&p_Var4->_M_left)[*(_Hash_node_base **)(p_Var4 + 1) < p_Var27]) {
            if (*(_Hash_node_base **)(p_Var4 + 1) >= p_Var27) {
              p_Var17 = p_Var4;
            }
          }
          p_Var26 = p_Var25;
          if (((_Rb_tree_header *)p_Var17 != p_Var25) &&
             (p_Var26 = (_Rb_tree_header *)p_Var17,
             p_Var27 < (_Hash_node_base *)((_Rb_tree_header *)p_Var17)->_M_node_count)) {
            p_Var26 = p_Var25;
          }
          if ((p_Var26 != p_Var25) &&
             (__v = *(unsigned_long **)(p_Var26 + 1),
             *(unsigned_long **)(p_Var26 + 1) != *(unsigned_long **)((long)(p_Var26 + 1) + 8))) {
            do {
              uVar5 = *__v;
              if (local_1d8._M_data == (type)0x0) {
                local_a0 = local_1c0;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_178,(unsigned_long *)&local_a0);
                uVar9 = local_178._8_8_;
                sStack_1d0.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)local_178._0_8_;
                _Var8._M_pi = sStack_1d0.internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi;
                local_178._0_8_ = (element_type *)0x0;
                local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                sStack_1d0.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar9;
                if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
                }
                pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&sStack_1d0);
                local_1d8._M_data =
                     *(Vector **)
                      &(pTVar18->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar6 = (byte)uVar5 & 0x3f;
              *(ulong *)(&(local_1d8._M_data)->vector_type + (uVar5 >> 6) * 8) =
                   *(ulong *)(&(local_1d8._M_data)->vector_type + (uVar5 >> 6) * 8) &
                   (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              puVar1 = __v + 1;
              if (puVar1 == *(unsigned_long **)((long)(p_Var26 + 1) + 8)) {
                ::std::
                _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                ::_M_insert_unique<unsigned_long_const&>
                          ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)local_1b8,__v);
              }
              __v = puVar1;
            } while (puVar1 != *(unsigned_long **)((long)(p_Var26 + 1) + 8));
          }
          if ((local_1d8._M_data == (type)0x0) ||
             ((*(ulong *)(&(local_1d8._M_data)->vector_type + ((ulong)p_Var27 >> 6) * 8) >>
               ((ulong)p_Var27 & 0x3f) & 1) != 0)) {
            if (OStack_c0.sel != (SelectionVector *)0x0) {
              (OStack_c0.sel)->sel_vector[local_f0._8_8_] = (sel_t)p_Var27;
            }
            local_f0._8_8_ = local_f0._8_8_ + 1;
          }
          p_Var27 = (_Hash_node_base *)((long)&p_Var27->_M_nxt + 1);
        } while (p_Var27 != p_Var24);
      }
      lstate_00 = local_110;
      count = local_190;
      if (local_180->action_type == UPDATE) {
        if ((local_180->do_update_condition).
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
          this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_178._0_8_ = local_178 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_178,
                     "Inner conflicts detected with a conditional DO UPDATE on-conflict action, not fully implemented yet"
                     ,"");
          NotImplementedException::NotImplementedException(this_03,(string *)local_178);
          __cxa_throw(this_03,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_178[0] = (duckdb)0x1;
        local_178._16_8_ = local_190;
        local_178._24_8_ = (sel_t *)0x0;
        uStack_158 = 0;
        local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        OptionalSelection::OptionalSelection(&local_148,(SelectionVector *)0x0);
        this_00 = (SelectionVector *)(local_178 + 0x18);
        local_178._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var19 = local_1a0;
        p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
        pSVar7 = local_148.sel;
        if (local_178[0] != (duckdb)0x0) {
          SelectionVector::Initialize(this_00,(idx_t)count);
          _Var8._M_pi = local_148.vec.selection_data.internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_148.vec.sel_vector = (sel_t *)local_178._24_8_;
          pSVar7 = &local_148.vec;
          local_148.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_148.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var19 = local_1a0;
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
          local_148.sel = pSVar7;
          if (_Var8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_148.sel = this_00;
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var8._M_pi);
            p_Var19 = local_1a0;
            p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
            local_148.sel = pSVar7;
          }
        }
        for (; pSVar10 = local_148.sel, p_Var19 != (_Rb_tree_node_base *)&prStack_1b0;
            p_Var19 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var19)) {
          p_Var23 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var23->_vptr__Sp_counted_base + 1);
          if (local_148.sel != (SelectionVector *)0x0) {
            (local_148.sel)->sel_vector[(long)((long)&p_Var23[-1]._M_weak_count + 3)] =
                 p_Var19[1]._M_color;
          }
          local_178._8_8_ = p_Var23;
          local_148.sel = pSVar7;
          pSVar7 = local_148.sel;
          local_148.sel = pSVar10;
        }
        local_148.sel = pSVar7;
        DataChunk::Reference(&lstate_00->update_chunk,insert_chunk);
        DataChunk::Slice(&lstate_00->update_chunk,this_00,local_178._8_8_);
        (lstate_00->update_chunk).count = local_178._8_8_;
        if (local_148.vec.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_148.vec.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
        }
      }
      DataChunk::Slice(insert_chunk,(SelectionVector *)(local_f0 + 0x18),local_f0._8_8_);
      insert_chunk->count = local_f0._8_8_;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_1b8);
      gstate_00 = local_108;
      table_01 = local_118;
      if (sStack_1d0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (sStack_1d0.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (OStack_c0.vec.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (OStack_c0.vec.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_next_resize !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_next_resize);
      }
    }
    op = local_180;
    iVar20 = HandleInsertConflicts<true>
                       (table_01,context,lstate_00,gstate_00,insert_chunk,local_180);
    iVar21 = HandleInsertConflicts<false>(table_01,context,lstate_00,gstate_00,insert_chunk,op);
    iVar21 = iVar21 + iVar20;
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<unsigned_long,_true>_>_>_>
    ::~_Rb_tree(&local_98);
    ::std::
    _Hashtable<duckdb::BoundIndex_*,_duckdb::BoundIndex_*,_std::allocator<duckdb::BoundIndex_*>,_std::__detail::_Identity,_std::equal_to<duckdb::BoundIndex_*>,_std::hash<duckdb::BoundIndex_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
  }
  return iVar21;
}

Assistant:

idx_t PhysicalInsert::OnConflictHandling(TableCatalogEntry &table, ExecutionContext &context, InsertGlobalState &gstate,
                                         InsertLocalState &lstate, DataChunk &insert_chunk) const {
	auto &data_table = table.GetStorage();
	auto &local_storage = LocalStorage::Get(context.client, data_table.db);

	if (action_type == OnConflictAction::THROW) {
		auto &constraint_state = lstate.GetConstraintState(data_table, table);
		auto storage = local_storage.GetStorage(data_table);
		data_table.VerifyAppendConstraints(constraint_state, context.client, insert_chunk, storage, nullptr);
		return 0;
	}

	ConflictInfo conflict_info(conflict_target);

	auto &global_indexes = data_table.GetDataTableInfo()->GetIndexes();
	auto &local_indexes = local_storage.GetIndexes(context.client, data_table);

	unordered_set<BoundIndex *> matched_indexes;
	if (conflict_info.column_ids.empty()) {
		// We care about every index that applies to the table if no ON CONFLICT (...) target is given
		global_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
		local_indexes.Scan([&](Index &index) {
			if (!index.IsUnique()) {
				return false;
			}
			if (conflict_info.ConflictTargetMatches(index)) {
				D_ASSERT(index.IsBound());
				auto &bound_index = index.Cast<BoundIndex>();
				matched_indexes.insert(&bound_index);
			}
			return false;
		});
	}

	auto inner_conflicts = CheckDistinctness(insert_chunk, conflict_info, matched_indexes);
	idx_t count = insert_chunk.size();
	if (!inner_conflicts.empty()) {
		// We have at least one inner conflict, filter it out
		ManagedSelection sel_vec(count);
		ValidityMask not_a_conflict(count);
		set<idx_t> last_occurrences_of_conflict;
		for (idx_t i = 0; i < count; i++) {
			auto it = inner_conflicts.find(i);
			if (it != inner_conflicts.end()) {
				auto &conflicts = it->second;
				auto conflict_it = conflicts.begin();
				for (; conflict_it != conflicts.end();) {
					auto &idx = *conflict_it;
					not_a_conflict.SetInvalid(idx);
					conflict_it++;
					if (conflict_it == conflicts.end()) {
						last_occurrences_of_conflict.insert(idx);
					}
				}
			}
			if (not_a_conflict.RowIsValid(i)) {
				sel_vec.Append(i);
			}
		}
		if (action_type == OnConflictAction::UPDATE) {
			if (do_update_condition) {
				//! See https://github.com/duckdblabs/duckdb-internal/issues/4090 for context
				throw NotImplementedException("Inner conflicts detected with a conditional DO UPDATE on-conflict "
				                              "action, not fully implemented yet");
			}
			ManagedSelection last_occurrences(last_occurrences_of_conflict.size());
			for (auto &idx : last_occurrences_of_conflict) {
				last_occurrences.Append(idx);
			}

			lstate.update_chunk.Reference(insert_chunk);
			lstate.update_chunk.Slice(last_occurrences.Selection(), last_occurrences.Count());
			lstate.update_chunk.SetCardinality(last_occurrences.Count());
		}

		insert_chunk.Slice(sel_vec.Selection(), sel_vec.Count());
		insert_chunk.SetCardinality(sel_vec.Count());
	}

	// Check whether any conflicts arise, and if they all meet the conflict_target + condition
	// If that's not the case - We throw the first error
	idx_t updated_tuples = 0;
	updated_tuples += HandleInsertConflicts<true>(table, context, lstate, gstate, insert_chunk, *this);
	// Also check the transaction-local storage+ART so we can detect conflicts within this transaction
	updated_tuples += HandleInsertConflicts<false>(table, context, lstate, gstate, insert_chunk, *this);

	return updated_tuples;
}